

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFExporter.cpp
# Opt level: O1

void __thiscall Assimp::D3MF::D3MFExporter::writeMetaData(D3MFExporter *this)

{
  ostringstream *poVar1;
  char *__s;
  uint uVar2;
  aiMetadata *paVar3;
  uint *puVar4;
  int iVar5;
  ulong uVar6;
  ostream *poVar7;
  ulong uVar8;
  long lVar9;
  char *__s1;
  ulong __n;
  size_t sVar10;
  string k;
  aiString value;
  aiString *local_880;
  undefined1 *local_858;
  ulong local_850;
  undefined1 local_848 [16];
  uint local_838;
  char local_834 [1024];
  uint local_434;
  undefined1 local_430 [1024];
  
  paVar3 = this->mScene->mMetaData;
  if ((paVar3 != (aiMetadata *)0x0) && (uVar6 = (ulong)paVar3->mNumProperties, uVar6 != 0)) {
    poVar1 = &this->mModelOutput;
    uVar8 = 0;
    local_880 = (aiString *)0x0;
    do {
      paVar3 = this->mScene->mMetaData;
      if (uVar8 < paVar3->mNumProperties) {
        local_880 = paVar3->mKeys + uVar8;
      }
      __s = local_880->data;
      std::__cxx11::string::string((string *)&local_858,__s,(allocator *)&local_434);
      local_838 = 0;
      local_834[0] = '\0';
      memset(local_834 + 1,0x1b,0x3ff);
      paVar3 = this->mScene->mMetaData;
      sVar10 = local_850 & 0xffffffff;
      if ((local_850 & 0xfffffc00) != 0) {
        sVar10 = 0x3ff;
      }
      local_434 = (uint)sVar10;
      memcpy(local_430,local_858,sVar10);
      local_430[sVar10] = 0;
      uVar2 = paVar3->mNumProperties;
      if ((ulong)uVar2 != 0) {
        __s1 = paVar3->mKeys->data;
        lVar9 = 0;
        do {
          if ((((aiString *)(__s1 + -4))->length == (uint)sVar10) &&
             (iVar5 = bcmp(__s1,local_430,(ulong)((aiString *)(__s1 + -4))->length), iVar5 == 0)) {
            if ((*(int *)((long)&paVar3->mValues->mType + lVar9) == 5) &&
               (puVar4 = *(uint **)((long)&paVar3->mValues->mData + lVar9), puVar4 != &local_838)) {
              local_838 = *puVar4;
              __n = (ulong)local_838;
              memcpy(local_834,puVar4 + 1,__n);
              local_834[__n] = '\0';
            }
            break;
          }
          lVar9 = lVar9 + 0x10;
          __s1 = __s1 + 0x404;
        } while ((ulong)uVar2 << 4 != lVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"<",1);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)poVar1,XmlTag::meta_abi_cxx11_,DAT_009e2a88);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,XmlTag::meta_name_abi_cxx11_,DAT_009e2aa8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"=\"",2);
      sVar10 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,__s,sVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\">",2);
      sVar10 = strlen(local_834);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,local_834,sVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"</",2);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)poVar1,XmlTag::meta_abi_cxx11_,DAT_009e2a88);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,">",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if (local_858 != local_848) {
        operator_delete(local_858);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar6);
  }
  return;
}

Assistant:

void D3MFExporter::writeMetaData() {
    if ( nullptr == mScene->mMetaData ) {
        return;
    }

    const unsigned int numMetaEntries( mScene->mMetaData->mNumProperties );
    if ( 0 == numMetaEntries ) {
        return;
    }

	const aiString *key = nullptr;
    const aiMetadataEntry *entry(nullptr);
    for ( size_t i = 0; i < numMetaEntries; ++i ) {
        mScene->mMetaData->Get( i, key, entry );
        std::string k( key->C_Str() );
        aiString value;
        mScene->mMetaData->Get(  k, value );
        mModelOutput << "<" << XmlTag::meta << " " << XmlTag::meta_name << "=\"" << key->C_Str() << "\">";
        mModelOutput << value.C_Str();
        mModelOutput << "</" << XmlTag::meta << ">" << std::endl;
    }
}